

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

bool __thiscall
cmTarget::GetMappedConfig
          (cmTarget *this,string *desired_config,char **loc,char **imp,string *suffix)

{
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  undefined7 extraout_var;
  string *s;
  undefined8 s_00;
  string mapProp;
  size_type __dnew;
  string impProp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mappedConfigs;
  string local_c8;
  char **local_a8;
  undefined4 local_9c;
  string local_98;
  undefined1 local_78 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  undefined8 local_48;
  string *local_38;
  
  if (this->TargetTypeValue == INTERFACE_LIBRARY) {
    return true;
  }
  local_a8 = imp;
  std::__cxx11::string::_M_replace((ulong)suffix,0,(char *)suffix->_M_string_length,0x522543);
  std::__cxx11::string::_M_append((char *)suffix,(ulong)(desired_config->_M_dataplus)._M_p);
  local_58._M_allocated_capacity = 0;
  local_58._8_8_ = (string *)0x0;
  local_48 = 0;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_98._M_dataplus._M_p = (pointer)0x14;
  local_c8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_c8,(ulong)&local_98);
  local_c8.field_2._M_allocated_capacity._0_7_ = SUB87(local_98._M_dataplus._M_p,0);
  local_c8.field_2._M_local_buf[7] = (char)((ulong)local_98._M_dataplus._M_p >> 0x38);
  *(undefined8 *)local_c8._M_dataplus._M_p = 0x4f504d495f50414d;
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p + 8) = 'R';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p + 9) = 'T';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p + 10) = 'E';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p + 0xb) = 'D';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p + 0xc) = '_';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p + 0xd) = 'C';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p + 0xe) = 'O';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p + 0xf) = 'N';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p + 0x10) = 'F';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p + 0x11) = 'I';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p + 0x12) = 'G';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p + 0x13) = '_';
  local_c8._M_string_length = (size_type)local_98._M_dataplus._M_p;
  local_c8._M_dataplus._M_p[(long)local_98._M_dataplus._M_p] = '\0';
  std::__cxx11::string::_M_append((char *)&local_c8,(ulong)(desired_config->_M_dataplus)._M_p);
  pcVar2 = GetProperty(this,&local_c8,this->Makefile);
  if (pcVar2 != (char *)0x0) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    sVar3 = strlen(pcVar2);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,pcVar2,pcVar2 + sVar3);
    cmSystemTools::ExpandListArgument
              (&local_98,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_58,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,
                      CONCAT17(local_98.field_2._M_local_buf[7],
                               local_98.field_2._M_allocated_capacity._0_7_) + 1);
    }
  }
  paVar4 = &local_c8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar4) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT17(local_c8.field_2._M_local_buf[7],
                             local_c8.field_2._M_allocated_capacity._0_7_) + 1);
    paVar4 = extraout_RAX;
  }
  if (this->DLLPlatform == true) {
    local_9c = (undefined4)CONCAT71((int7)((ulong)paVar4 >> 8),1);
    if (this->TargetTypeValue != SHARED_LIBRARY) {
      bVar1 = IsExecutableWithExports(this);
      local_9c = (undefined4)CONCAT71(extraout_var,bVar1);
    }
  }
  else {
    local_9c = 0;
  }
  bVar1 = *loc != (char *)0x0;
  if (*loc == (char *)0x0) {
    bVar1 = false;
    if ((*local_a8 == (char *)0x0) &&
       (bVar1 = false, local_58._M_allocated_capacity != local_58._8_8_)) {
      s_00 = local_58._M_allocated_capacity;
      do {
        cmsys::SystemTools::UpperCase(&local_c8,(string *)s_00);
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        local_78._0_8_ = (string *)0x12;
        local_98._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)local_78);
        local_98.field_2._M_allocated_capacity._0_7_ = (undefined7)local_78._0_8_;
        local_98.field_2._M_local_buf[7] = SUB81(local_78._0_8_,7);
        *(undefined8 *)local_98._M_dataplus._M_p = 0x444554524f504d49;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p + 8) = '_';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p + 9) = 'L';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p + 10) = 'O';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p + 0xb) = 'C';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p + 0xc) = 'A';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p + 0xd) = 'T';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p + 0xe) = 'I';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p + 0xf) = 'O';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p + 0x10) = 'N';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p + 0x11) = '_';
        local_98._M_string_length = local_78._0_8_;
        local_98._M_dataplus._M_p[local_78._0_8_] = '\0';
        std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_c8._M_dataplus._M_p);
        pcVar2 = GetProperty(this,&local_98,this->Makefile);
        *loc = pcVar2;
        if ((char)local_9c != '\0') {
          local_78._0_8_ = local_78 + 0x10;
          local_38 = (string *)0x10;
          local_78._0_8_ = std::__cxx11::string::_M_create((ulong *)local_78,(ulong)&local_38);
          local_78._16_8_ = local_38;
          (((string *)local_78._0_8_)->_M_dataplus)._M_p = (pointer)0x444554524f504d49;
          ((string *)local_78._0_8_)->_M_string_length = 0x5f42494c504d495f;
          local_78._8_8_ = local_38;
          *(undefined1 *)
           ((long)&(((string *)local_78._0_8_)->_M_dataplus)._M_p +
           (long)&(local_38->_M_dataplus)._M_p) = 0;
          std::__cxx11::string::_M_append((char *)local_78,(ulong)local_c8._M_dataplus._M_p);
          pcVar2 = GetProperty(this,(string *)local_78,this->Makefile);
          *local_a8 = pcVar2;
          if ((string *)local_78._0_8_ != (string *)(local_78 + 0x10)) {
            operator_delete((void *)local_78._0_8_,(ulong)(local_78._16_8_ + 1));
          }
        }
        if ((*loc != (char *)0x0) || (*local_a8 != (char *)0x0)) {
          std::__cxx11::string::_M_replace
                    ((ulong)suffix,0,(char *)suffix->_M_string_length,0x522543);
          std::__cxx11::string::_M_append((char *)suffix,(ulong)local_c8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,
                          CONCAT17(local_98.field_2._M_local_buf[7],
                                   local_98.field_2._M_allocated_capacity._0_7_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,
                          CONCAT17(local_c8.field_2._M_local_buf[7],
                                   local_c8.field_2._M_allocated_capacity._0_7_) + 1);
        }
        bVar1 = *loc != (char *)0x0;
      } while (((!bVar1) && (*local_a8 == (char *)0x0)) &&
              (s_00 = s_00 + 0x20, s_00 != local_58._8_8_));
    }
  }
  if (((bVar1) || (local_58._M_allocated_capacity == local_58._8_8_)) || (*local_a8 != (char *)0x0))
  {
    if ((!bVar1) && (*local_a8 == (char *)0x0)) {
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      local_98._M_dataplus._M_p = (pointer)0x11;
      local_c8._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_c8,(ulong)&local_98);
      local_c8.field_2._M_allocated_capacity._0_7_ = SUB87(local_98._M_dataplus._M_p,0);
      local_c8.field_2._M_local_buf[7] = (char)((ulong)local_98._M_dataplus._M_p >> 0x38);
      *(undefined8 *)local_c8._M_dataplus._M_p = 0x444554524f504d49;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p + 8) = '_';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p + 9) = 'L';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p + 10) = 'O';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p + 0xb) = 'C';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p + 0xc) = 'A';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p + 0xd) = 'T';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p + 0xe) = 'I';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p + 0xf) = 'O';
      local_c8._M_dataplus._M_p[0x10] = 'N';
      local_c8._M_string_length = (size_type)local_98._M_dataplus._M_p;
      local_c8._M_dataplus._M_p[(long)local_98._M_dataplus._M_p] = '\0';
      std::__cxx11::string::_M_append((char *)&local_c8,(ulong)(suffix->_M_dataplus)._M_p);
      pcVar2 = GetProperty(this,&local_c8,this->Makefile);
      *loc = pcVar2;
      if ((char)local_9c != '\0') {
        local_98.field_2._M_allocated_capacity._0_7_ = 0x4554524f504d49;
        local_98.field_2._M_local_buf[7] = 'D';
        local_98.field_2._8_7_ = 0x42494c504d495f;
        local_98._M_string_length = 0xf;
        local_98.field_2._M_local_buf[0xf] = '\0';
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_append((char *)&local_98,(ulong)(suffix->_M_dataplus)._M_p);
        pcVar2 = GetProperty(this,&local_98,this->Makefile);
        *local_a8 = pcVar2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,
                          CONCAT17(local_98.field_2._M_local_buf[7],
                                   local_98.field_2._M_allocated_capacity._0_7_) + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,
                        CONCAT17(local_c8.field_2._M_local_buf[7],
                                 local_c8.field_2._M_allocated_capacity._0_7_) + 1);
      }
    }
    if ((*loc == (char *)0x0) && (*local_a8 == (char *)0x0)) {
      std::__cxx11::string::_M_replace((ulong)suffix,0,(char *)suffix->_M_string_length,0x53c2a5);
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      local_98._M_dataplus._M_p = (pointer)0x11;
      local_c8._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_c8,(ulong)&local_98);
      local_c8.field_2._M_allocated_capacity._0_7_ = SUB87(local_98._M_dataplus._M_p,0);
      local_c8.field_2._M_local_buf[7] = (char)((ulong)local_98._M_dataplus._M_p >> 0x38);
      *(undefined8 *)local_c8._M_dataplus._M_p = 0x444554524f504d49;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p + 8) = '_';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p + 9) = 'L';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p + 10) = 'O';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p + 0xb) = 'C';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p + 0xc) = 'A';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p + 0xd) = 'T';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p + 0xe) = 'I';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p + 0xf) = 'O';
      local_c8._M_dataplus._M_p[0x10] = 'N';
      local_c8._M_string_length = (size_type)local_98._M_dataplus._M_p;
      local_c8._M_dataplus._M_p[(long)local_98._M_dataplus._M_p] = '\0';
      pcVar2 = GetProperty(this,&local_c8,this->Makefile);
      *loc = pcVar2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,
                        CONCAT17(local_c8.field_2._M_local_buf[7],
                                 local_c8.field_2._M_allocated_capacity._0_7_) + 1);
      }
      if ((char)local_9c != '\0') {
        local_c8.field_2._M_allocated_capacity._0_7_ = 0x4554524f504d49;
        local_c8.field_2._M_local_buf[7] = 'D';
        local_c8.field_2._8_7_ = 0x42494c504d495f;
        local_c8._M_string_length = 0xf;
        local_c8.field_2._M_local_buf[0xf] = '\0';
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        pcVar2 = GetProperty(this,&local_c8,this->Makefile);
        *local_a8 = pcVar2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,
                          CONCAT17(local_c8.field_2._M_local_buf[7],
                                   local_c8.field_2._M_allocated_capacity._0_7_) + 1);
        }
      }
    }
    if ((*loc == (char *)0x0) && (*local_a8 == (char *)0x0)) {
      local_78._0_8_ = (string *)0x0;
      local_78._8_8_ = (string *)0x0;
      local_78._16_8_ = (string *)0x0;
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      local_98._M_dataplus._M_p = (pointer)0x17;
      local_c8._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_c8,(ulong)&local_98);
      local_c8.field_2._M_allocated_capacity._0_7_ = SUB87(local_98._M_dataplus._M_p,0);
      local_c8.field_2._M_local_buf[7] = (char)((ulong)local_98._M_dataplus._M_p >> 0x38);
      *(undefined8 *)local_c8._M_dataplus._M_p = 0x444554524f504d49;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p + 8) = '_';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p + 9) = 'C';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p + 10) = 'O';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p + 0xb) = 'N';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p + 0xc) = 'F';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p + 0xd) = 'I';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p + 0xe) = 'G';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p + 0xf) = 'U';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p + 0xf) = 'U';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p + 0x10) = 'R';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p + 0x11) = 'A';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p + 0x12) = 'T';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p + 0x13) = 'I';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p + 0x14) = 'O';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p + 0x15) = 'N';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p + 0x16) = 'S';
      local_c8._M_string_length = (size_type)local_98._M_dataplus._M_p;
      local_c8._M_dataplus._M_p[(long)local_98._M_dataplus._M_p] = '\0';
      pcVar2 = GetProperty(this,&local_c8,this->Makefile);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,
                        CONCAT17(local_c8.field_2._M_local_buf[7],
                                 local_c8.field_2._M_allocated_capacity._0_7_) + 1);
      }
      if (pcVar2 != (char *)0x0) {
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        sVar3 = strlen(pcVar2);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,pcVar2,pcVar2 + sVar3);
        cmSystemTools::ExpandListArgument
                  (&local_c8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_78,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,
                          CONCAT17(local_c8.field_2._M_local_buf[7],
                                   local_c8.field_2._M_allocated_capacity._0_7_) + 1);
        }
      }
      if (*loc == (char *)0x0) {
        s = (string *)local_78._0_8_;
        do {
          if ((*local_a8 != (char *)0x0) || (s == (string *)local_78._8_8_)) break;
          std::__cxx11::string::_M_replace
                    ((ulong)suffix,0,(char *)suffix->_M_string_length,0x522543);
          cmsys::SystemTools::UpperCase(&local_c8,s);
          std::__cxx11::string::_M_append((char *)suffix,(ulong)local_c8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,
                            CONCAT17(local_c8.field_2._M_local_buf[7],
                                     local_c8.field_2._M_allocated_capacity._0_7_) + 1);
          }
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          local_98._M_dataplus._M_p = (pointer)0x11;
          local_c8._M_dataplus._M_p =
               (pointer)std::__cxx11::string::_M_create((ulong *)&local_c8,(ulong)&local_98);
          local_c8.field_2._M_allocated_capacity._0_7_ = SUB87(local_98._M_dataplus._M_p,0);
          local_c8.field_2._M_local_buf[7] = (char)((ulong)local_98._M_dataplus._M_p >> 0x38);
          *(undefined8 *)local_c8._M_dataplus._M_p = 0x444554524f504d49;
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c8._M_dataplus._M_p + 8) = '_';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c8._M_dataplus._M_p + 9) = 'L';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c8._M_dataplus._M_p + 10) = 'O';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c8._M_dataplus._M_p + 0xb) = 'C';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c8._M_dataplus._M_p + 0xc) = 'A';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c8._M_dataplus._M_p + 0xd) = 'T';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c8._M_dataplus._M_p + 0xe) = 'I';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c8._M_dataplus._M_p + 0xf) = 'O';
          local_c8._M_dataplus._M_p[0x10] = 'N';
          local_c8._M_string_length = (size_type)local_98._M_dataplus._M_p;
          local_c8._M_dataplus._M_p[(long)local_98._M_dataplus._M_p] = '\0';
          std::__cxx11::string::_M_append((char *)&local_c8,(ulong)(suffix->_M_dataplus)._M_p);
          pcVar2 = GetProperty(this,&local_c8,this->Makefile);
          *loc = pcVar2;
          if ((char)local_9c != '\0') {
            local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
            local_98.field_2._8_7_ = 0x42494c504d495f;
            local_98.field_2._M_allocated_capacity._0_7_ = 0x4554524f504d49;
            local_98.field_2._M_local_buf[7] = 'D';
            local_98._M_string_length = 0xf;
            local_98.field_2._M_local_buf[0xf] = '\0';
            std::__cxx11::string::_M_append((char *)&local_98,(ulong)(suffix->_M_dataplus)._M_p);
            pcVar2 = GetProperty(this,&local_98,this->Makefile);
            *local_a8 = pcVar2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p,
                              CONCAT17(local_98.field_2._M_local_buf[7],
                                       local_98.field_2._M_allocated_capacity._0_7_) + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,
                            CONCAT17(local_c8.field_2._M_local_buf[7],
                                     local_c8.field_2._M_allocated_capacity._0_7_) + 1);
          }
          s = s + 1;
        } while (*loc == (char *)0x0);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_78);
    }
    if ((*loc != (char *)0x0) || (*local_a8 != (char *)0x0)) {
      bVar1 = true;
      goto LAB_0031aaf6;
    }
  }
  bVar1 = false;
LAB_0031aaf6:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_58);
  return bVar1;
}

Assistant:

bool cmTarget::GetMappedConfig(std::string const& desired_config,
                               const char** loc,
                               const char** imp,
                               std::string& suffix) const
{
  if (this->GetType() == INTERFACE_LIBRARY)
    {
    // This method attempts to find a config-specific LOCATION for the
    // IMPORTED library. In the case of INTERFACE_LIBRARY, there is no
    // LOCATION at all, so leaving *loc and *imp unchanged is the appropriate
    // and valid response.
    return true;
    }

  // Track the configuration-specific property suffix.
  suffix = "_";
  suffix += desired_config;

  std::vector<std::string> mappedConfigs;
  {
  std::string mapProp = "MAP_IMPORTED_CONFIG_";
  mapProp += desired_config;
  if(const char* mapValue = this->GetProperty(mapProp))
    {
    cmSystemTools::ExpandListArgument(mapValue, mappedConfigs);
    }
  }

  // If we needed to find one of the mapped configurations but did not
  // On a DLL platform there may be only IMPORTED_IMPLIB for a shared
  // library or an executable with exports.
  bool allowImp = this->HasImportLibrary();

  // If a mapping was found, check its configurations.
  for(std::vector<std::string>::const_iterator mci = mappedConfigs.begin();
      !*loc && !*imp && mci != mappedConfigs.end(); ++mci)
    {
    // Look for this configuration.
    std::string mcUpper = cmSystemTools::UpperCase(*mci);
    std::string locProp = "IMPORTED_LOCATION_";
    locProp += mcUpper;
    *loc = this->GetProperty(locProp);
    if(allowImp)
      {
      std::string impProp = "IMPORTED_IMPLIB_";
      impProp += mcUpper;
      *imp = this->GetProperty(impProp);
      }

    // If it was found, use it for all properties below.
    if(*loc || *imp)
      {
      suffix = "_";
      suffix += mcUpper;
      }
    }

  // If we needed to find one of the mapped configurations but did not
  // then the target is not found.  The project does not want any
  // other configuration.
  if(!mappedConfigs.empty() && !*loc && !*imp)
    {
    return false;
    }

  // If we have not yet found it then there are no mapped
  // configurations.  Look for an exact-match.
  if(!*loc && !*imp)
    {
    std::string locProp = "IMPORTED_LOCATION";
    locProp += suffix;
    *loc = this->GetProperty(locProp);
    if(allowImp)
      {
      std::string impProp = "IMPORTED_IMPLIB";
      impProp += suffix;
      *imp = this->GetProperty(impProp);
      }
    }

  // If we have not yet found it then there are no mapped
  // configurations and no exact match.
  if(!*loc && !*imp)
    {
    // The suffix computed above is not useful.
    suffix = "";

    // Look for a configuration-less location.  This may be set by
    // manually-written code.
    *loc = this->GetProperty("IMPORTED_LOCATION");
    if(allowImp)
      {
      *imp = this->GetProperty("IMPORTED_IMPLIB");
      }
    }

  // If we have not yet found it then the project is willing to try
  // any available configuration.
  if(!*loc && !*imp)
    {
    std::vector<std::string> availableConfigs;
    if(const char* iconfigs = this->GetProperty("IMPORTED_CONFIGURATIONS"))
      {
      cmSystemTools::ExpandListArgument(iconfigs, availableConfigs);
      }
    for(std::vector<std::string>::const_iterator
          aci = availableConfigs.begin();
        !*loc && !*imp && aci != availableConfigs.end(); ++aci)
      {
      suffix = "_";
      suffix += cmSystemTools::UpperCase(*aci);
      std::string locProp = "IMPORTED_LOCATION";
      locProp += suffix;
      *loc = this->GetProperty(locProp);
      if(allowImp)
        {
        std::string impProp = "IMPORTED_IMPLIB";
        impProp += suffix;
        *imp = this->GetProperty(impProp);
        }
      }
    }
  // If we have not yet found it then the target is not available.
  if(!*loc && !*imp)
    {
    return false;
    }

  return true;
}